

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O1

DFsSection * __thiscall DFsScript::NewSection(DFsScript *this,char *brace)

{
  char *pcVar1;
  int iVar2;
  TObjPtr<DFsSection> this_00;
  
  pcVar1 = this->data;
  this_00.field_0 =
       (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)
       M_Malloc_Dbg(0x40,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                    ,0x1f9);
  DObject::DObject((DObject *)this_00.field_0);
  *(undefined ***)this_00.field_0 = &PTR_StaticType_0070ecd8;
  (((TObjPtr<DFsSection> *)((long)this_00.field_0 + 0x38))->field_0).p = (DFsSection *)0x0;
  iVar2 = ((int)brace - (int)pcVar1) % 0x11;
  *(int *)&((DObject *)((long)this_00.field_0 + 0x28))->_vptr_DObject =
       (int)brace - *(int *)&this->data;
  ((TObjPtr<DFsSection> *)((long)this_00.field_0 + 0x38))->field_0 = this->sections[iVar2].field_0;
  this->sections[iVar2].field_0 = this_00.field_0;
  if (((*(byte *)((long)this_00.field_0 + 0x20) & 3) != 0) &&
     (((this->super_DObject).ObjectFlags & 4) != 0)) {
    GC::Barrier(&this->super_DObject,(DObject *)this_00.field_0);
  }
  return (DFsSection *)this_00.field_0;
}

Assistant:

DFsSection *DFsScript::NewSection(const char *brace)
{
	int n = section_hash(brace);
	DFsSection *newsec = new DFsSection;
	
	newsec->start_index = MakeIndex(brace);
	newsec->next = sections[n];
	sections[n] = newsec;
	GC::WriteBarrier(this, newsec);
	return newsec;
}